

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_linear_workflow.cpp
# Opt level: O1

ON_LinearWorkflow * __thiscall
ON_LinearWorkflow::operator=(ON_LinearWorkflow *this,ON_LinearWorkflow *lw)

{
  bool bVar1;
  float fVar2;
  
  if (this != lw) {
    bVar1 = PreProcessTexturesOn(lw);
    SetPreProcessTexturesOn(this,bVar1);
    bVar1 = PreProcessColorsOn(lw);
    SetPreProcessColorsOn(this,bVar1);
    bVar1 = PreProcessGammaOn(lw);
    SetPreProcessGammaOn(this,bVar1);
    bVar1 = PostProcessGammaOn(lw);
    SetPostProcessGammaOn(this,bVar1);
    fVar2 = PostProcessGamma(lw);
    SetPostProcessGamma(this,fVar2);
    fVar2 = PostProcessGamma(lw);
    SetPostProcessGamma(this,fVar2);
  }
  return this;
}

Assistant:

const ON_LinearWorkflow& ON_LinearWorkflow::operator = (const ON_LinearWorkflow& lw)
{
  if (this != &lw)
  {
    // When copying the object, we need to directly copy the underlying XML. So we can't allow
    // virtual overrides to execute because they might hide the real values we want to copy.
    using LW = ON_LinearWorkflow;
    LW::SetPreProcessTexturesOn    (lw.LW::PreProcessTexturesOn());
    LW::SetPreProcessColorsOn      (lw.LW::PreProcessColorsOn());
    LW::SetPostProcessFrameBufferOn(lw.LW::PostProcessFrameBufferOn());
    LW::SetPreProcessGammaOn       (lw.LW::PreProcessGammaOn());
    LW::SetPostProcessGammaOn      (lw.LW::PostProcessGammaOn());
    LW::SetPreProcessGamma         (lw.LW::PreProcessGamma());
    LW::SetPostProcessGamma        (lw.LW::PostProcessGamma());
  }

  return *this;
}